

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O0

void __thiscall
LPCMStreamReader::removeChannel
          (LPCMStreamReader *this,uint8_t *start,uint8_t *end,int cnNum,int mch)

{
  int iVar1;
  uint local_4c;
  uint8_t *local_40;
  uint8_t *curPos;
  uint8_t *dst;
  int fullSampleSize;
  int ch1SampleSize;
  int mch_local;
  int cnNum_local;
  uint8_t *end_local;
  uint8_t *start_local;
  LPCMStreamReader *this_local;
  
  if (mch == cnNum) {
    if (this->m_bitsPerSample == 0x14) {
      local_4c = 3;
    }
    else {
      local_4c = this->m_bitsPerSample / 8;
    }
    iVar1 = mch * local_4c;
    curPos = start;
    for (local_40 = start; local_40 < end; local_40 = local_40 + iVar1) {
      memmove(curPos,local_40,(long)iVar1);
      curPos = curPos + (int)(iVar1 - local_4c);
    }
    return;
  }
  __assert_fail("mch == cnNum",
                "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/lpcmStreamReader.cpp"
                ,0xa4,
                "void LPCMStreamReader::removeChannel(uint8_t *, const uint8_t *, const int, const int) const"
               );
}

Assistant:

void LPCMStreamReader::removeChannel(uint8_t* start, const uint8_t* end, const int cnNum, const int mch) const
{
    // int mch = m_channels + (m_channels%2==1 ? 1 : 0);
    assert(mch == cnNum);
    const int ch1SampleSize = (m_bitsPerSample == 20 ? 3 : m_bitsPerSample / 8);
    const int fullSampleSize = mch * ch1SampleSize;
    uint8_t* dst = start;
    for (const uint8_t* curPos = start; curPos < end; curPos += fullSampleSize)
    {
        memmove(dst, curPos, fullSampleSize);
        dst += fullSampleSize - ch1SampleSize;
    }
}